

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcOrientedEdge::IfcOrientedEdge(IfcOrientedEdge *this)

{
  IfcOrientedEdge *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x78,"IfcOrientedEdge");
  IfcEdge::IfcEdge(&this->super_IfcEdge,&PTR_construction_vtable_24__00f02ca8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcOrientedEdge,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcOrientedEdge,_2UL> *)
             &(this->super_IfcEdge).field_0x40,&PTR_construction_vtable_24__00f02d20);
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf02bf0;
  *(undefined8 *)&this->field_0x78 = 0xf02c90;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf02c18;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf02c40;
  *(undefined8 *)&(this->super_IfcEdge).field_0x40 = 0xf02c68;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcEdge>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcEdge> *)&(this->super_IfcEdge).field_0x50,
             (LazyObject *)0x0);
  std::__cxx11::string::string((string *)&this->Orientation);
  return;
}

Assistant:

IfcOrientedEdge() : Object("IfcOrientedEdge") {}